

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O0

void fmt::v5::internal::format_value<char,bidfx_public_api::SubscriptionStatus>
               (basic_buffer<char> *buffer,SubscriptionStatus *value)

{
  undefined8 uVar1;
  size_t new_size;
  long local_170;
  basic_ostream<char,_std::char_traits<char>_> output;
  undefined1 local_60 [8];
  formatbuf<char> format_buf;
  SubscriptionStatus *value_local;
  basic_buffer<char> *buffer_local;
  
  format_buf.buffer_ = (basic_buffer<char> *)value;
  formatbuf<char>::formatbuf((formatbuf<char> *)local_60,buffer);
  std::ostream::ostream(&local_170,(streambuf *)local_60);
  uVar1 = *(undefined8 *)(local_170 + -0x18);
  std::operator|(_S_failbit,_S_badbit);
  std::ios::exceptions((int)&local_170 + (int)uVar1);
  bidfx_public_api::operator<<((ostream *)&local_170,(SubscriptionStatus *)format_buf.buffer_);
  new_size = basic_buffer<char>::size(buffer);
  basic_buffer<char>::resize(buffer,new_size);
  std::ostream::~ostream(&local_170);
  formatbuf<char>::~formatbuf((formatbuf<char> *)local_60);
  return;
}

Assistant:

void format_value(basic_buffer<Char> &buffer, const T &value) {
  internal::formatbuf<Char> format_buf(buffer);
  std::basic_ostream<Char> output(&format_buf);
  output.exceptions(std::ios_base::failbit | std::ios_base::badbit);
  output << value;
  buffer.resize(buffer.size());
}